

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

char * Wln_ObjName(Wln_Ntk_t *p,int iObj)

{
  Abc_Nam_t *p_00;
  int iVar1;
  char *pcVar2;
  
  if (0 < (p->vNameIds).nSize) {
    iVar1 = Vec_IntEntry(&p->vNameIds,iObj);
    if (iVar1 != 0) {
      p_00 = p->pManName;
      iVar1 = Vec_IntEntry(&p->vNameIds,iObj);
      pcVar2 = Abc_NamStr(p_00,iVar1);
      return pcVar2;
    }
  }
  sprintf(Wln_ObjName::Buffer,"n%d",iObj);
  return Wln_ObjName::Buffer;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creating objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Wln_ObjName( Wln_Ntk_t * p, int iObj )
{
    static char Buffer[100];
    if ( Wln_NtkHasNameId(p) && Wln_ObjNameId(p, iObj) )
        return Abc_NamStr( p->pManName, Wln_ObjNameId(p, iObj) );
    sprintf( Buffer, "n%d", iObj );
    return Buffer;
}